

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O1

void CostManagerClear(CostManager *manager)

{
  CostInterval *pCVar1;
  long lVar2;
  CostInterval *pCVar3;
  
  if (manager != (CostManager *)0x0) {
    WebPSafeFree(manager->costs);
    WebPSafeFree(manager->cache_intervals);
    if (manager->head != (CostInterval *)0x0) {
      pCVar1 = manager->head;
      do {
        pCVar3 = pCVar1->next;
        if (manager->intervals + 9 < pCVar1 || pCVar1 < manager->intervals) {
          WebPSafeFree(pCVar1);
        }
        pCVar1 = pCVar3;
      } while (pCVar3 != (CostInterval *)0x0);
    }
    manager->head = (CostInterval *)0x0;
    if (manager->recycled_intervals != (CostInterval *)0x0) {
      pCVar1 = manager->recycled_intervals;
      do {
        pCVar3 = pCVar1->next;
        if (manager->intervals + 9 < pCVar1 || pCVar1 < manager->intervals) {
          WebPSafeFree(pCVar1);
        }
        pCVar1 = pCVar3;
      } while (pCVar3 != (CostInterval *)0x0);
    }
    memset(manager,0,0x81c8);
    pCVar1 = (CostInterval *)(manager->cost_cache + 0xffc);
    lVar2 = 10;
    pCVar3 = (CostInterval *)0x0;
    do {
      pCVar1[1].next = pCVar3;
      pCVar1 = pCVar1 + 1;
      lVar2 = lVar2 + -1;
      pCVar3 = pCVar1;
    } while (lVar2 != 0);
    manager->free_intervals = pCVar1;
  }
  return;
}

Assistant:

static void CostManagerClear(CostManager* const manager) {
  if (manager == NULL) return;

  WebPSafeFree(manager->costs);
  WebPSafeFree(manager->cache_intervals);

  // Clear the interval lists.
  DeleteIntervalList(manager, manager->head);
  manager->head = NULL;
  DeleteIntervalList(manager, manager->recycled_intervals);
  manager->recycled_intervals = NULL;

  // Reset pointers, 'count' and 'cache_intervals_size'.
  memset(manager, 0, sizeof(*manager));
  CostManagerInitFreeList(manager);
}